

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanoprintf.h
# Opt level: O2

int npf_vpprintf(npf_putc pc,void *pc_ctx,char *format,__va_list_tag *args)

{
  byte bVar1;
  int *piVar2;
  byte *pbVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  byte bVar9;
  ulong in_R8;
  undefined7 uVar10;
  ulong in_R9;
  uint7 uVar12;
  ulong uVar11;
  byte *pbVar13;
  char cVar14;
  int iVar15;
  int i;
  bool bVar16;
  uint uVar17;
  anon_union_24_2_9e8356ad u;
  
  iVar15 = 0;
  for (; bVar1 = *format, bVar1 != 0x25; format = (char *)((byte *)format + 1)) {
    if (bVar1 == 0) {
      return iVar15;
    }
switchD_00104b96_caseD_71:
    iVar15 = iVar15 + 1;
    (*pc)((int)(char)bVar1,pc_ctx);
  }
  uVar8 = 0;
  uVar17 = 0;
  pbVar3 = (byte *)format;
  do {
    uVar12 = (uint7)(in_R9 >> 8);
    in_R9 = (ulong)uVar12 << 8;
    pbVar3 = pbVar3 + 2;
LAB_00104a09:
    bVar9 = pbVar3[-1];
    uVar10 = (undefined7)(in_R8 >> 8);
    in_R8 = CONCAT71(uVar10,bVar9);
    switch(bVar9) {
    case 0x2a:
      in_R8 = CONCAT71(uVar10,*pbVar3);
      cVar14 = '\x02';
      goto LAB_00104ac6;
    case 0x2b:
      uVar17 = 0x2b;
      uVar8 = 0x2b;
LAB_00104a7c:
      pbVar3 = pbVar3 + -1;
      break;
    case 0x2d:
      pbVar3 = pbVar3 + -1;
      break;
    case 0x30:
      goto switchD_00104a22_caseD_30;
    default:
      if (bVar9 == 0x20) {
        bVar16 = (char)uVar8 == '\0';
        in_R8 = 0;
        in_R9 = (ulong)uVar17;
        if (bVar16) {
          in_R9 = 0x20;
        }
        uVar17 = (uint)in_R9;
        if (bVar16) {
          uVar8 = 0x20;
        }
        goto LAB_00104a7c;
      }
      if (bVar9 == 0x23) {
        pbVar3 = pbVar3 + -1;
        break;
      }
    case 0x2c:
    case 0x2e:
    case 0x2f:
      pbVar3 = pbVar3 + -1;
      cVar14 = '\0';
      for (; uVar6 = (int)in_R8 - 0x30, uVar8 = (ulong)uVar6, (byte)uVar6 < 10;
          in_R8 = CONCAT71((int7)(in_R8 >> 8),*pbVar13)) {
        pbVar13 = pbVar3 + 1;
        pbVar3 = pbVar3 + 1;
        cVar14 = '\x01';
      }
LAB_00104ac6:
      uVar6 = (uint)in_R8;
      if ((char)in_R8 == '.') {
        uVar8 = 0;
        if (pbVar3[1] == 0x2d) {
          pbVar3 = pbVar3 + 2;
          uVar11 = 0;
        }
        else {
          if (pbVar3[1] == 0x2a) {
            uVar6 = (uint)pbVar3[2];
            pbVar3 = pbVar3 + 2;
            uVar11 = CONCAT71(uVar12,2);
            goto LAB_00104afb;
          }
          pbVar3 = pbVar3 + 1;
          uVar11 = CONCAT71(uVar12,1);
        }
        iVar5 = 0;
        while( true ) {
          uVar6 = (uint)CONCAT71((int7)(in_R8 >> 8),*pbVar3);
          uVar7 = uVar6 - 0x30;
          uVar8 = (ulong)uVar7;
          if (9 < (byte)uVar7) break;
          in_R8 = (ulong)(uint)(iVar5 * 10);
          pbVar3 = pbVar3 + 1;
          iVar5 = (uVar7 & 0xff) + iVar5 * 10;
        }
      }
      else {
        uVar11 = 0;
      }
LAB_00104afb:
      pbVar13 = pbVar3 + 1;
      bVar9 = (byte)uVar6;
      if (bVar9 == 0x6c) {
        uVar8 = CONCAT71((int7)(uVar8 >> 8),4);
LAB_00104b29:
        bVar9 = *pbVar13;
      }
      else if ((uVar6 & 0xff) == 0x68) {
        bVar9 = *pbVar13;
        uVar8 = 1;
        if (bVar9 == 0x68) {
          pbVar3 = pbVar3 + 2;
          uVar8 = 3;
          pbVar13 = pbVar3;
          goto LAB_00104b29;
        }
      }
      else {
        uVar8 = 0;
        pbVar13 = pbVar3;
      }
      in_R9 = uVar11 & 0xffffffff;
      in_R8 = 0;
      iVar5 = 6;
      uVar4 = CONCAT71((int7)((ulong)pbVar3 >> 8),0x20);
      uVar6 = bVar9 - 0x6f;
      if (uVar6 < 10) {
        in_R8 = (long)&switchD_00104b96::switchdataD_00117020 +
                (long)(int)(&switchD_00104b96::switchdataD_00117020)[uVar6];
        iVar5 = 6;
        switch((uint)bVar9) {
        case 0x6f:
          iVar5 = 5;
          break;
        case 0x70:
          iVar5 = 8;
          goto LAB_00104c15;
        default:
          goto switchD_00104b96_caseD_71;
        case 0x73:
          iVar5 = 3;
          goto LAB_00104c18;
        case 0x75:
          iVar5 = 7;
          break;
        case 0x78:
          break;
        }
switchD_00104b96_caseD_78:
        in_R9 = uVar11 & 0xffffffff;
        in_R8 = 0;
      }
      else {
        if (bVar9 != 0x25) {
          if (bVar9 == 0x58) {
            uVar4 = 0;
          }
          else {
            in_R9 = uVar11 & 0xffffffff;
            if ((bVar9 != 0x69) && (bVar9 != 100)) {
              if (bVar9 != 99) goto switchD_00104b96_caseD_71;
              iVar5 = 2;
              goto LAB_00104c15;
            }
            iVar5 = 4;
          }
          goto switchD_00104b96_caseD_78;
        }
        iVar5 = 1;
LAB_00104c15:
        in_R9 = 0;
      }
LAB_00104c18:
      if ((int)pbVar13 + 1 != (int)format) {
        if (cVar14 == '\x02') {
          if (args->gp_offset < 0x29) {
            args->gp_offset = args->gp_offset + 8;
          }
          else {
            args->overflow_arg_area = (void *)((long)args->overflow_arg_area + 8);
          }
        }
        if ((char)in_R9 == '\x02') {
          uVar6 = args->gp_offset;
          if ((ulong)uVar6 < 0x29) {
            piVar2 = (int *)((ulong)uVar6 + (long)args->reg_save_area);
            args->gp_offset = uVar6 + 8;
          }
          else {
            piVar2 = (int *)args->overflow_arg_area;
            args->overflow_arg_area = piVar2 + 2;
          }
          in_R9 = CONCAT71((int7)(in_R9 >> 8),(-1 < *piVar2) * '\x02');
        }
        iVar15 = (*(code *)(&DAT_00117048 + *(int *)(&DAT_00117048 + (ulong)(iVar5 - 1) * 4)))
                           (&DAT_00117048 + *(int *)(&DAT_00117048 + (ulong)(iVar5 - 1) * 4),uVar8,
                            uVar4,uVar8 & 0xff,uVar4 & 0xff,in_R9,uVar17);
        return iVar15;
      }
      goto switchD_00104b96_caseD_71;
    }
  } while( true );
switchD_00104a22_caseD_30:
  pbVar3 = pbVar3 + 1;
  goto LAB_00104a09;
}

Assistant:

int npf_vpprintf(npf_putc pc, void *pc_ctx, char const *format, va_list args) {
  npf_format_spec_t fs;
  char const *cur = format;
  npf_cnt_putc_ctx_t pc_cnt;
  pc_cnt.pc = pc;
  pc_cnt.ctx = pc_ctx;
  pc_cnt.n = 0;

  while (*cur) {
    int const fs_len = (*cur != '%') ? 0 : npf_parse_format_spec(cur, &fs);
    if (!fs_len) { NPF_PUTC(*cur++); continue; }
    cur += fs_len;

    // Extract star-args immediately
#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
    if (fs.field_width_opt == NPF_FMT_SPEC_OPT_STAR) {
      fs.field_width = va_arg(args, int);
      if (fs.field_width < 0) {
        fs.field_width = -fs.field_width;
        fs.left_justified = 1;
      }
    }
#endif
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
    if (fs.prec_opt == NPF_FMT_SPEC_OPT_STAR) {
      fs.prec = va_arg(args, int);
      if (fs.prec < 0) { fs.prec_opt = NPF_FMT_SPEC_OPT_NONE; }
    }
#endif

    union { char cbuf_mem[NANOPRINTF_CONVERSION_BUFFER_SIZE]; npf_uint_t binval; } u;
    char *cbuf = u.cbuf_mem, sign_c = 0;
    int cbuf_len = 0, need_0x = 0;
#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
    int field_pad = 0;
    char pad_c = 0;
#endif
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
    int prec_pad = 0;
#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
    int zero = 0;
#endif
#endif

    // Extract and convert the argument to string, point cbuf at the text.
    switch (fs.conv_spec) {
      case NPF_FMT_SPEC_CONV_PERCENT:
        *cbuf = '%';
        cbuf_len = 1;
        break;

      case NPF_FMT_SPEC_CONV_CHAR:
        *cbuf = (char)va_arg(args, int);
        cbuf_len = 1;
        break;

      case NPF_FMT_SPEC_CONV_STRING: {
        cbuf = va_arg(args, char *);
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
        for (char const *s = cbuf;
             ((fs.prec_opt == NPF_FMT_SPEC_OPT_NONE) || (cbuf_len < fs.prec)) && cbuf && *s;
             ++s, ++cbuf_len);
#else
        for (char const *s = cbuf; cbuf && *s; ++s, ++cbuf_len); // strlen
#endif
      } break;

      case NPF_FMT_SPEC_CONV_SIGNED_INT: {
        npf_int_t val = 0;
        switch (fs.length_modifier) {
          NPF_EXTRACT(NONE, int, int);
          NPF_EXTRACT(SHORT, short, int);
          NPF_EXTRACT(LONG_DOUBLE, int, int);
          NPF_EXTRACT(CHAR, signed char, int);
          NPF_EXTRACT(LONG, long, long);
#if NANOPRINTF_USE_LARGE_FORMAT_SPECIFIERS == 1
          NPF_EXTRACT(LARGE_LONG_LONG, long long, long long);
          NPF_EXTRACT(LARGE_INTMAX, intmax_t, intmax_t);
          NPF_EXTRACT(LARGE_SIZET, npf_ssize_t, npf_ssize_t);
          NPF_EXTRACT(LARGE_PTRDIFFT, ptrdiff_t, ptrdiff_t);
#endif
          default: break;
        }

        sign_c = (val < 0) ? '-' : fs.prepend;

#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
        zero = !val;
#endif
        // special case, if prec and value are 0, skip
        if (!val && (fs.prec_opt != NPF_FMT_SPEC_OPT_NONE) && !fs.prec) {
          cbuf_len = 0;
        } else
#endif
        {
          npf_uint_t uval = (npf_uint_t)val;
          if (val < 0) { uval = 0 - uval; }
          cbuf_len = npf_utoa_rev(uval, cbuf, 10, fs.case_adjust);
        }
      } break;

#if NANOPRINTF_USE_BINARY_FORMAT_SPECIFIERS == 1
      case NPF_FMT_SPEC_CONV_BINARY:
#endif
      case NPF_FMT_SPEC_CONV_OCTAL:
      case NPF_FMT_SPEC_CONV_HEX_INT:
      case NPF_FMT_SPEC_CONV_UNSIGNED_INT: {
        npf_uint_t val = 0;

        switch (fs.length_modifier) {
          NPF_EXTRACT(NONE, unsigned, unsigned);
          NPF_EXTRACT(SHORT, unsigned short, unsigned);
          NPF_EXTRACT(LONG_DOUBLE, unsigned, unsigned);
          NPF_EXTRACT(CHAR, unsigned char, unsigned);
          NPF_EXTRACT(LONG, unsigned long, unsigned long);
#if NANOPRINTF_USE_LARGE_FORMAT_SPECIFIERS == 1
          NPF_EXTRACT(LARGE_LONG_LONG, unsigned long long, unsigned long long);
          NPF_EXTRACT(LARGE_INTMAX, uintmax_t, uintmax_t);
          NPF_EXTRACT(LARGE_SIZET, size_t, size_t);
          NPF_EXTRACT(LARGE_PTRDIFFT, size_t, size_t);
#endif
          default: break;
        }

#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
        zero = !val;
#endif
        if (!val && (fs.prec_opt != NPF_FMT_SPEC_OPT_NONE) && !fs.prec) {
          // Zero value and explicitly-requested zero precision means "print nothing".
          if ((fs.conv_spec == NPF_FMT_SPEC_CONV_OCTAL) && fs.alt_form) {
            fs.prec = 1; // octal special case, print a single '0'
          }
        } else
#endif
#if NANOPRINTF_USE_BINARY_FORMAT_SPECIFIERS == 1
        if (fs.conv_spec == NPF_FMT_SPEC_CONV_BINARY) {
          cbuf_len = npf_bin_len(val); u.binval = val;
        } else
#endif
        {
          uint_fast8_t const base = (fs.conv_spec == NPF_FMT_SPEC_CONV_OCTAL) ?
            8u : ((fs.conv_spec == NPF_FMT_SPEC_CONV_HEX_INT) ? 16u : 10u);
          cbuf_len = npf_utoa_rev(val, cbuf, base, fs.case_adjust);
        }

        if (val && fs.alt_form && (fs.conv_spec == NPF_FMT_SPEC_CONV_OCTAL)) {
          cbuf[cbuf_len++] = '0'; // OK to add leading octal '0' immediately.
        }

        if (val && fs.alt_form) { // 0x or 0b but can't write it yet.
          if (fs.conv_spec == NPF_FMT_SPEC_CONV_HEX_INT) { need_0x = 'X'; }
#if NANOPRINTF_USE_BINARY_FORMAT_SPECIFIERS == 1
          else if (fs.conv_spec == NPF_FMT_SPEC_CONV_BINARY) { need_0x = 'B'; }
#endif
          if (need_0x) { need_0x += fs.case_adjust; }
        }
      } break;

      case NPF_FMT_SPEC_CONV_POINTER: {
        cbuf_len =
          npf_utoa_rev((npf_uint_t)(uintptr_t)va_arg(args, void *), cbuf, 16, 'a' - 'A');
        need_0x = 'x';
      } break;

#if NANOPRINTF_USE_WRITEBACK_FORMAT_SPECIFIERS == 1
      case NPF_FMT_SPEC_CONV_WRITEBACK:
        switch (fs.length_modifier) {
          NPF_WRITEBACK(NONE, int);
          NPF_WRITEBACK(SHORT, short);
          NPF_WRITEBACK(LONG, long);
          NPF_WRITEBACK(LONG_DOUBLE, double);
          NPF_WRITEBACK(CHAR, signed char);
#if NANOPRINTF_USE_LARGE_FORMAT_SPECIFIERS == 1
          NPF_WRITEBACK(LARGE_LONG_LONG, long long);
          NPF_WRITEBACK(LARGE_INTMAX, intmax_t);
          NPF_WRITEBACK(LARGE_SIZET, size_t);
          NPF_WRITEBACK(LARGE_PTRDIFFT, ptrdiff_t);
#endif
          default: break;
        } break;
#endif

#if NANOPRINTF_USE_FLOAT_FORMAT_SPECIFIERS == 1
      case NPF_FMT_SPEC_CONV_FLOAT_DEC:
      case NPF_FMT_SPEC_CONV_FLOAT_SCI:
      case NPF_FMT_SPEC_CONV_FLOAT_SHORTEST:
      case NPF_FMT_SPEC_CONV_FLOAT_HEX: {
        double val;
        if (fs.length_modifier == NPF_FMT_SPEC_LEN_MOD_LONG_DOUBLE) {
          val = (double)va_arg(args, long double);
        } else {
          val = va_arg(args, double);
        }

        sign_c = (val < 0.) ? '-' : fs.prepend;
#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
        zero = (val == 0.);
#endif
        cbuf_len = npf_ftoa_rev(cbuf, &fs, val);
      } break;
#endif
      default: break;
    }

#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
    // Compute the field width pad character
    if (fs.field_width_opt != NPF_FMT_SPEC_OPT_NONE) {
      if (fs.leading_zero_pad) { // '0' flag is only legal with numeric types
        if ((fs.conv_spec != NPF_FMT_SPEC_CONV_STRING) &&
            (fs.conv_spec != NPF_FMT_SPEC_CONV_CHAR) &&
            (fs.conv_spec != NPF_FMT_SPEC_CONV_PERCENT)) {
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
          if ((fs.prec_opt != NPF_FMT_SPEC_OPT_NONE) && !fs.prec && zero) {
            pad_c = ' ';
          } else
#endif
          { pad_c = '0'; }
        }
      } else { pad_c = ' '; }
    }
#endif

    // Compute the number of bytes to truncate or '0'-pad.
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
    if (fs.conv_spec != NPF_FMT_SPEC_CONV_STRING) {
#if NANOPRINTF_USE_FLOAT_FORMAT_SPECIFIERS == 1
      // float precision is after the decimal point
      if ((fs.conv_spec != NPF_FMT_SPEC_CONV_FLOAT_DEC) &&
          (fs.conv_spec != NPF_FMT_SPEC_CONV_FLOAT_SCI) &&
          (fs.conv_spec != NPF_FMT_SPEC_CONV_FLOAT_SHORTEST) &&
          (fs.conv_spec != NPF_FMT_SPEC_CONV_FLOAT_HEX))
#endif
      { prec_pad = npf_max(0, fs.prec - cbuf_len); }
    }
#endif

#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
    // Given the full converted length, how many pad bytes?
    field_pad = fs.field_width - cbuf_len - !!sign_c;
    if (need_0x) { field_pad -= 2; }
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
    field_pad -= prec_pad;
#endif
    field_pad = npf_max(0, field_pad);

    // Apply right-justified field width if requested
    if (!fs.left_justified && pad_c) { // If leading zeros pad, sign goes first.
      if (pad_c == '0') {
        if (sign_c) { NPF_PUTC(sign_c); sign_c = 0; }
        // Pad byte is '0', write '0x' before '0' pad chars.
        if (need_0x) { NPF_PUTC('0'); NPF_PUTC(need_0x); }
      }
      while (field_pad-- > 0) { NPF_PUTC(pad_c); }
      // Pad byte is ' ', write '0x' after ' ' pad chars but before number.
      if ((pad_c != '0') && need_0x) { NPF_PUTC('0'); NPF_PUTC(need_0x); }
    } else
#endif
    { if (need_0x) { NPF_PUTC('0'); NPF_PUTC(need_0x); } } // no pad, '0x' requested.

    // Write the converted payload
    if (fs.conv_spec == NPF_FMT_SPEC_CONV_STRING) {
      for (int i = 0; cbuf && (i < cbuf_len); ++i) { NPF_PUTC(cbuf[i]); }
    } else {
      if (sign_c) { NPF_PUTC(sign_c); }
#if NANOPRINTF_USE_PRECISION_FORMAT_SPECIFIERS == 1
      while (prec_pad-- > 0) { NPF_PUTC('0'); } // int precision leads.
#endif
#if NANOPRINTF_USE_BINARY_FORMAT_SPECIFIERS == 1
      if (fs.conv_spec == NPF_FMT_SPEC_CONV_BINARY) {
        while (cbuf_len) { NPF_PUTC('0' + ((u.binval >> --cbuf_len) & 1)); }
      } else
#endif
      { while (cbuf_len-- > 0) { NPF_PUTC(cbuf[cbuf_len]); } } // payload is reversed
    }

#if NANOPRINTF_USE_FIELD_WIDTH_FORMAT_SPECIFIERS == 1
    if (fs.left_justified && pad_c) { // Apply left-justified field width
      while (field_pad-- > 0) { NPF_PUTC(pad_c); }
    }
#endif
  }

  return pc_cnt.n;
}